

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O1

int dfft_execute(cpx_t *h_in,cpx_t *h_out,int dir,dfft_plan p)

{
  plan_t **pppVar1;
  int ndim;
  int *dim;
  int *embed;
  int *pdim;
  int *pidx;
  MPI_Comm comm;
  int *dfft_offset_recv;
  int *dfft_offset_send;
  int *dfft_nrecv;
  int *dfft_nsend;
  int row_m;
  int *proc_map;
  int iVar2;
  plan_t **pppVar3;
  cpx_t *work;
  cpx_t *local_a8;
  
  work = p.scratch;
  iVar2 = 2;
  if (p.device == 0) {
    if (h_in == h_out) {
      local_a8 = p.scratch;
      work = h_in;
    }
    else {
      local_a8 = p.scratch_2;
      memcpy(p.scratch,h_in,(long)p.size_in << 3);
    }
    iVar2 = p.input_cyclic;
    if ((dir == 0 && p.input_cyclic == 0) || ((dir != 0 && (p.output_cyclic == 0)))) {
      redistribute_nd(p.gdim,p.pdim,p.ndim,p.pidx,p.size_in,p.inembed,work,local_a8,p.nsend,p.nrecv,
                      p.offset_send,p.offset_recv,0,p.comm,p.proc_map,p.row_m);
    }
    proc_map = p.proc_map;
    row_m = p.row_m;
    dfft_nsend = p.nsend;
    dfft_nrecv = p.nrecv;
    dfft_offset_send = p.offset_send;
    dfft_offset_recv = p.offset_recv;
    comm = p.comm;
    pidx = p.pidx;
    pdim = p.pdim;
    embed = p.oembed;
    dim = p.gdim;
    ndim = p.ndim;
    pppVar3 = &p.plans_long_forward;
    pppVar1 = &p.plans_short_forward;
    if (dir != 0) {
      pppVar3 = &p.plans_long_inverse;
      pppVar1 = &p.plans_short_inverse;
    }
    mpifftnd_dif(p.gdim,p.pdim,p.ndim,p.pidx,dir,p.size_in,p.inembed,p.oembed,work,local_a8,*pppVar1
                 ,*pppVar3,p.rho_L,p.rho_pk0,p.rho_Lk0,p.nsend,p.nrecv,p.offset_send,p.offset_recv,
                 p.comm,p.proc_map,p.row_m);
    if ((dir != 0 && iVar2 == 0) || (dir == 0 && p.output_cyclic == 0)) {
      redistribute_nd(dim,pdim,ndim,pidx,p.size_out,embed,work,local_a8,dfft_nsend,dfft_nrecv,
                      dfft_offset_send,dfft_offset_recv,1,comm,proc_map,row_m);
    }
    iVar2 = 0;
    if (h_in != h_out) {
      memcpy(h_out,work,(long)p.size_out << 3);
    }
  }
  return iVar2;
}

Assistant:

int dfft_execute(cpx_t *h_in, cpx_t *h_out, int dir, dfft_plan p)
    {
    /* only works on host plans */
    if (p.device) return 2;

    int out_of_place = (h_in == h_out) ? 0 : 1;

    cpx_t *scratch, *work;

    if (out_of_place)
        {
        work = p.scratch;
        scratch = p.scratch_2;
        memcpy(work, h_in, p.size_in*sizeof(cpx_t));
        }
    else
        {
        scratch = p.scratch;
        /*! FIXME need to ensure in buf size >= scratch_size */
        work = h_in;
        }

    if ((!dir && !p.input_cyclic) || (dir && !p.output_cyclic))
        {
        /* redistribution of input */
        redistribute_nd(p.gdim, p.pdim, p.ndim, p.pidx,
            p.size_in, p.inembed, work, scratch, p.nsend,p.nrecv,
            p.offset_send,p.offset_recv, 0, p.comm, p.proc_map, p.row_m);
        }

    /* multi-dimensional FFT */
    mpifftnd_dif(p.gdim, p.pdim, p.ndim, p.pidx, dir,
        p.size_in,p.inembed,p.oembed, work, scratch,
        dir ? p.plans_short_inverse : p.plans_short_forward,
        dir ? p.plans_long_inverse : p.plans_long_forward,
        p.rho_L, p.rho_pk0, p.rho_Lk0, p.nsend,p.nrecv,
        p.offset_send,p.offset_recv, p.comm, p.proc_map, p.row_m);

    if ((dir && !p.input_cyclic) || (!dir && !p.output_cyclic))
        {
        /* redistribution of output */
        redistribute_nd(p.gdim, p.pdim, p.ndim, p.pidx,
            p.size_out,p.oembed, work, scratch, p.nsend,p.nrecv,
            p.offset_send,p.offset_recv, 1, p.comm, p.proc_map, p.row_m);
        }

    if (out_of_place)
        {
        memcpy(h_out, work, sizeof(cpx_t)*p.size_out);
        }

    return 0;
    }